

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::BinaryExpr<const_duckdb::StatementType_&,_const_duckdb::StatementType_&>::
streamReconstructedExpression
          (BinaryExpr<const_duckdb::StatementType_&,_const_duckdb::StatementType_&> *this,
          ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  type local_60;
  type local_40;
  
  Detail::convertUnstreamable<duckdb::StatementType>(&local_40,this->m_lhs);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  Detail::convertUnstreamable<duckdb::StatementType>(&local_60,this->m_rhs);
  op.m_size = (size_type)&local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }